

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_comparator.cpp
# Opt level: O0

int bidfx_public_api::price::subject::SubjectComparatorUtils::CompareQuantity(string *s1,string *s2)

{
  double dVar1;
  double dVar2;
  exception e;
  double val2;
  double val1;
  int cmp;
  string *s2_local;
  string *s1_local;
  
  s1_local._4_4_ = CompareObject(s1,s2);
  if (s1_local._4_4_ == 2) {
    dVar1 = std::__cxx11::stod(s1,(size_t *)0x0);
    dVar2 = std::__cxx11::stod(s2,(size_t *)0x0);
    if (dVar2 <= dVar1) {
      s1_local._4_4_ = (uint)(dVar1 != dVar2);
    }
    else {
      s1_local._4_4_ = 0xffffffff;
    }
  }
  return s1_local._4_4_;
}

Assistant:

int SubjectComparatorUtils::CompareQuantity(const std::string& s1, const std::string& s2)
{
    int cmp = CompareObject(s1, s2);
    if (cmp != BOTH_NON_NULL) return cmp;
    try
    {
        double val1 = std::stod(s1);
        double val2 = std::stod(s2);

        if (val1 < val2) return -1;
        return val1 == val2 ? 0 : 1;
    }
    catch (std::exception e)
    {
        return s1.compare(s2);
    }
}